

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_file_utils.cpp
# Opt level: O0

void crnlib::file_utils::combine_path(dynamic_string *dst,char *pA,char *pB)

{
  bool bVar1;
  char c_00;
  char *in_RDX;
  char c;
  dynamic_string temp;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  dynamic_string *this;
  dynamic_string local_28;
  char *local_18;
  
  this = &local_28;
  local_18 = in_RDX;
  dynamic_string::dynamic_string
            (this,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  bVar1 = dynamic_string::is_empty(this);
  if ((!bVar1) && (bVar1 = is_path_separator(*local_18), !bVar1)) {
    in_stack_ffffffffffffffbc = dynamic_string::get_len(&local_28);
    c_00 = dynamic_string::operator[](this,in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffb8 = CONCAT13(c_00,(int3)in_stack_ffffffffffffffb8);
    bVar1 = is_path_separator(c_00);
    if (!bVar1) {
      dynamic_string::append_char(this,(char)(in_stack_ffffffffffffffbc >> 0x18));
    }
  }
  dynamic_string::operator+=
            (this,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  dynamic_string::swap
            (this,(dynamic_string *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  dynamic_string::~dynamic_string(this);
  return;
}

Assistant:

void file_utils::combine_path(dynamic_string& dst, const char* pA, const char* pB) {
  dynamic_string temp(pA);
  if ((!temp.is_empty()) && (!is_path_separator(pB[0]))) {
    char c = temp[temp.get_len() - 1];
    if (!is_path_separator(c))
      temp.append_char(CRNLIB_PATH_SEPERATOR_CHAR);
  }
  temp += pB;
  dst.swap(temp);
}